

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

void __thiscall
simple_thread_pool::ThreadPoolMgr::registerThreadId
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  int iVar1;
  __hashtable *__h;
  pthread_t local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->threadIdsLock);
  if (iVar1 == 0) {
    local_30 = pthread_self();
    local_28 = (t_handle->
               super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    local_20 = (t_handle->
               super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    std::
    _Hashtable<std::thread::id,std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
              ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->threadIds,&local_30);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadIdsLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void registerThreadId(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::thread::id tid = std::this_thread::get_id();

        std::lock_guard<std::mutex> l(threadIdsLock);
        threadIds.insert({tid, t_handle});
    }